

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<double>_>::ReallocForNuma(TPZSkylMatrix<std::complex<double>_> *this)

{
  complex<double> *pcVar1;
  complex<double> *pcVar2;
  complex<double> *pcVar3;
  long lVar4;
  int64_t iVar5;
  complex<double> **ppcVar6;
  long in_RDI;
  TPZVec<std::complex<double>_> *in_stack_00000010;
  int i;
  complex<double> *new_start;
  complex<double> *old_start;
  TPZVec<std::complex<double>_*> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  TPZVec<std::complex<double>_*>::ReallocForNuma(in_stack_ffffffffffffffd0);
  pcVar2 = TPZVec<std::complex<double>_>::operator[]
                     ((TPZVec<std::complex<double>_> *)(in_RDI + 0x40),0);
  TPZVec<std::complex<double>_>::ReallocForNuma(in_stack_00000010);
  pcVar3 = TPZVec<std::complex<double>_>::operator[]
                     ((TPZVec<std::complex<double>_> *)(in_RDI + 0x40),0);
  local_1c = 0;
  while( true ) {
    lVar4 = (long)local_1c;
    iVar5 = TPZVec<std::complex<double>_*>::size((TPZVec<std::complex<double>_*> *)(in_RDI + 0x20));
    if (iVar5 <= lVar4) break;
    ppcVar6 = TPZVec<std::complex<double>_*>::operator[]
                        ((TPZVec<std::complex<double>_*> *)(in_RDI + 0x20),(long)local_1c);
    pcVar1 = *ppcVar6;
    ppcVar6 = TPZVec<std::complex<double>_*>::operator[]
                        ((TPZVec<std::complex<double>_*> *)(in_RDI + 0x20),(long)local_1c);
    *ppcVar6 = pcVar3 + ((long)pcVar1 - (long)pcVar2 >> 4);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void ReallocForNuma() {
        fElem.ReallocForNuma();
        TVar* old_start = &fStorage[0];
        fStorage.ReallocForNuma();
        TVar* new_start = &fStorage[0];
        for (int i=0; i<fElem.size(); i++) {
            fElem[i] = new_start + (fElem[i]-old_start);
        }
	}